

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

int uv__try_write(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle)

{
  uv_handle_type uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  msghdr msg;
  undefined8 local_a0;
  undefined8 local_98;
  ulong local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  msghdr local_60;
  
  uVar2 = uv__getiovmax();
  if ((int)uVar2 < (int)nbufs) {
    nbufs = uVar2;
  }
  if (send_handle == (uv_stream_t *)0x0) {
    do {
      iVar3 = (stream->io_watcher).fd;
      if (nbufs == 1) {
        uVar6 = write(iVar3,bufs->base,bufs->len);
      }
      else {
        uVar6 = writev(iVar3,(iovec *)bufs,nbufs);
      }
      if (uVar6 != 0xffffffffffffffff) goto LAB_0011b7be;
      piVar5 = __errno_location();
      iVar3 = *piVar5;
    } while (iVar3 == 4);
  }
  else {
    if ((send_handle->flags & 3) != 0) {
      uVar6 = 0xfffffff7;
      goto LAB_0011b7df;
    }
    uVar1 = send_handle->type;
    lVar4 = 0xb8;
    if ((uVar1 != UV_NAMED_PIPE) && (uVar1 != UV_TCP)) {
      if (uVar1 != UV_UDP) goto LAB_0011b7f2;
      lVar4 = 0xb0;
    }
    uVar2 = *(uint *)((long)send_handle->handle_queue + lVar4 + -0x20);
    local_70 = 0;
    uStack_68 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_90 = 0;
    uStack_88 = 0;
    if ((int)uVar2 < 0) {
LAB_0011b7f2:
      __assert_fail("fd_to_send >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                    ,0x34c,
                    "int uv__try_write(uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *)"
                   );
    }
    local_60.msg_name = (void *)0x0;
    local_60.msg_namelen = 0;
    local_60.msg_iovlen = (size_t)(int)nbufs;
    local_60.msg_flags = 0;
    local_60.msg_control = &local_a0;
    local_60.msg_controllen = 0x18;
    local_98 = 0x100000001;
    local_a0 = 0x14;
    local_90 = (ulong)uVar2;
    local_60.msg_iov = (iovec *)bufs;
    do {
      uVar6 = sendmsg((stream->io_watcher).fd,&local_60,0);
      if (uVar6 != 0xffffffffffffffff) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
LAB_0011b7be:
    if (-1 < (long)uVar6) goto LAB_0011b7df;
    piVar5 = __errno_location();
    iVar3 = *piVar5;
  }
  uVar6 = 0xfffffff5;
  if ((iVar3 != 0xb) && (iVar3 != 0x69)) {
    uVar6 = (ulong)(uint)-iVar3;
  }
LAB_0011b7df:
  return (int)uVar6;
}

Assistant:

static int uv__try_write(uv_stream_t* stream,
                         const uv_buf_t bufs[],
                         unsigned int nbufs,
                         uv_stream_t* send_handle) {
  struct iovec* iov;
  int iovmax;
  int iovcnt;
  ssize_t n;

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  iov = (struct iovec*) bufs;
  iovcnt = nbufs;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */
  if (send_handle != NULL) {
    int fd_to_send;
    struct msghdr msg;
    struct cmsghdr *cmsg;
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    if (uv__is_closing(send_handle))
      return UV_EBADF;

    fd_to_send = uv__handle_fd((uv_handle_t*) send_handle);

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  }

  if (n >= 0)
    return n;

  if (IS_TRANSIENT_WRITE_ERROR(errno, send_handle))
    return UV_EAGAIN;

  return UV__ERR(errno);
}